

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_map_s.hpp
# Opt level: O1

iterator __thiscall
estl::
sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
::do_find_bisect(sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
                 *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pvVar2;
  bool bVar3;
  size_type sVar4;
  uint uVar5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__p;
  ulong uVar6;
  size_type __n;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar7;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar8;
  value_type elem;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  paVar1 = &local_b0.first.field_2;
  local_b0.first._M_string_length = 0;
  local_b0.first.field_2._M_local_buf[0] = '\0';
  local_b0.first._M_dataplus._M_p = (pointer)paVar1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_70,key,&local_b0.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0.first._M_dataplus._M_p,
                    CONCAT71(local_b0.first.field_2._M_allocated_capacity._1_7_,
                             local_b0.first.field_2._M_local_buf[0]) + 1);
  }
  pvVar2 = (this->data_vec_).data_ptr_;
  ppVar8 = pvVar2 + (this->data_vec_).size_;
  __p = std::
        __lower_bound<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::pair<std::__cxx11::string_const,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_val<estl::sort_map_s<std::__cxx11::string,std::__cxx11::string,30ul,std::less<std::__cxx11::string>,10ul>::comperator>>
                  (pvVar2,ppVar8,&local_70);
  if (__p != ppVar8) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_b0,__p);
    sVar4 = local_b0.first._M_string_length;
    __n = local_70.first._M_string_length;
    if (local_b0.first._M_string_length < local_70.first._M_string_length) {
      __n = local_b0.first._M_string_length;
    }
    if (__n == 0) {
      uVar6 = 0;
    }
    else {
      uVar5 = memcmp(local_70.first._M_dataplus._M_p,local_b0.first._M_dataplus._M_p,__n);
      uVar6 = (ulong)uVar5;
    }
    if ((int)uVar6 == 0) {
      uVar6 = 0xffffffff80000000;
      if (-0x80000000 < (long)(local_70.first._M_string_length - sVar4)) {
        uVar6 = local_70.first._M_string_length - sVar4;
      }
      if (0x7ffffffe < (long)uVar6) {
        uVar6 = 0x7fffffff;
      }
    }
    ppVar7 = __p;
    bVar3 = true;
    if (-1 < (int)uVar6) goto LAB_00102cb6;
  }
  ppVar7 = ppVar8;
  bVar3 = __p != ppVar8;
LAB_00102cb6:
  if (bVar3) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.second._M_dataplus._M_p != &local_b0.second.field_2) {
      operator_delete(local_b0.second._M_dataplus._M_p,
                      local_b0.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0.first._M_dataplus._M_p,
                      CONCAT71(local_b0.first.field_2._M_allocated_capacity._1_7_,
                               local_b0.first.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.second._M_dataplus._M_p != &local_70.second.field_2) {
    operator_delete(local_70.second._M_dataplus._M_p,
                    local_70.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.first._M_dataplus._M_p != &local_70.first.field_2) {
    operator_delete(local_70.first._M_dataplus._M_p,local_70.first.field_2._M_allocated_capacity + 1
                   );
  }
  return ppVar7;
}

Assistant:

iterator do_find_bisect (const Key& key)
    {
        //std::cerr << "do_find_bisect(" << key << ")\n";
        const value_type elem (key,T());

        const iterator it_end = end();
        const iterator it = std::lower_bound(data_vec_.begin(), it_end, elem, comperator_);
        return !(it == it_end) && !comperator_(elem, *it) ? it : it_end;
    }